

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::MapKeySorter::MapKeyComparator::operator()
          (MapKeyComparator *this,MapKey *a,MapKey *b)

{
  bool bVar1;
  bool bVar2;
  CppType CVar3;
  int32 iVar4;
  int32 iVar5;
  uint32 uVar6;
  uint32 uVar7;
  string *__lhs;
  string *__rhs;
  LogMessage *other;
  int64 iVar8;
  int64 iVar9;
  uint64 uVar10;
  uint64 uVar11;
  LogFinisher local_51;
  LogMessage local_50;
  
  CVar3 = MapKey::type(a);
  switch(CVar3) {
  case CPPTYPE_INT32:
    iVar4 = MapKey::GetInt32Value(a);
    iVar5 = MapKey::GetInt32Value(b);
    bVar2 = SBORROW4(iVar4,iVar5);
    bVar1 = iVar4 - iVar5 < 0;
    goto LAB_0028bbb4;
  case CPPTYPE_INT64:
    iVar8 = MapKey::GetInt64Value(a);
    iVar9 = MapKey::GetInt64Value(b);
    bVar2 = SBORROW8(iVar8,iVar9);
    bVar1 = iVar8 - iVar9 < 0;
LAB_0028bbb4:
    bVar1 = bVar2 != bVar1;
    break;
  case CPPTYPE_UINT32:
    uVar6 = MapKey::GetUInt32Value(a);
    uVar7 = MapKey::GetUInt32Value(b);
    bVar1 = uVar6 < uVar7;
    break;
  case CPPTYPE_UINT64:
    uVar10 = MapKey::GetUInt64Value(a);
    uVar11 = MapKey::GetUInt64Value(b);
    bVar1 = uVar10 < uVar11;
    break;
  default:
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/wire_format.cc"
               ,0x321);
    other = LogMessage::operator<<(&local_50,"Invalid key for map field.");
    LogFinisher::operator=(&local_51,other);
    LogMessage::~LogMessage(&local_50);
    bVar1 = true;
    break;
  case CPPTYPE_BOOL:
    bVar2 = MapKey::GetBoolValue(a);
    bVar1 = MapKey::GetBoolValue(b);
    bVar1 = !bVar2 && bVar1;
    break;
  case CPPTYPE_STRING:
    __lhs = MapKey::GetStringValue_abi_cxx11_(a);
    __rhs = MapKey::GetStringValue_abi_cxx11_(b);
    bVar1 = std::operator<(__lhs,__rhs);
    return bVar1;
  }
  return bVar1;
}

Assistant:

bool operator()(const MapKey& a, const MapKey& b) const {
      GOOGLE_DCHECK(a.type() == b.type());
      switch (a.type()) {
#define CASE_TYPE(CppType, CamelCppType)                                \
  case FieldDescriptor::CPPTYPE_##CppType: {                            \
    return a.Get##CamelCppType##Value() < b.Get##CamelCppType##Value(); \
  }
        CASE_TYPE(STRING, String)
        CASE_TYPE(INT64, Int64)
        CASE_TYPE(INT32, Int32)
        CASE_TYPE(UINT64, UInt64)
        CASE_TYPE(UINT32, UInt32)
        CASE_TYPE(BOOL, Bool)
#undef CASE_TYPE

        default:
          GOOGLE_LOG(DFATAL) << "Invalid key for map field.";
          return true;
      }
    }